

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator>>=(ChFrame<double> *this,ChQuaternion<double> *R)

{
  ChQuaternion<double> local_50;
  ChVector<double> local_30;
  ChQuaternion<double> *local_18;
  ChQuaternion<double> *R_local;
  ChFrame<double> *this_local;
  
  local_18 = R;
  R_local = (ChQuaternion<double> *)this;
  ChQuaternion<double>::Rotate(&local_30,R,&(this->coord).pos);
  ChQuaternion<double>::operator>>(&local_50,&(this->coord).rot,local_18);
  SetCoord(this,&local_30,&local_50);
  return this;
}

Assistant:

ChFrame<Real>& operator>>=(const ChQuaternion<Real>& R) {
        this->SetCoord(R.Rotate(this->coord.pos), this->coord.rot >> R);
        return *this;
    }